

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O3

bool __thiscall
Rml::DataModel::BindFunc(DataModel *this,String *name,DataGetFunc *get_func,DataSetFunc *set_func)

{
  FuncDefinition *__ptr;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  DataVariable variable;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  _Any_data local_58;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_48;
  
  local_58._M_unused._M_object = (void *)0x0;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FuncDefinition,std::default_delete<Rml::FuncDefinition>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::emplace<std::__cxx11::string_const&,decltype(nullptr)>
            (&local_48,&this->function_variable_definitions,name,(void **)&local_58);
  if (local_48.second == false) {
    bVar3 = false;
    Log::Message(LT_ERROR,"Data get/set function with name %s already exists in model",
                 (name->_M_dataplus)._M_p);
  }
  else {
    local_58._8_8_ = &((local_48.first.mKeyVals)->mData).second;
    ::std::
    make_unique<Rml::FuncDefinition,std::function<void(Rml::Variant&)>,std::function<void(Rml::Variant_const&)>>
              ((function<void_(Rml::Variant_&)> *)&local_58,
               (function<void_(const_Rml::Variant_&)> *)get_func);
    uVar2 = local_58._8_8_;
    uVar1 = local_58._M_unused._0_8_;
    local_58._M_unused._M_object = (FuncDefinition *)0x0;
    __ptr = ((local_48.first.mKeyVals)->mData).second._M_t.
            super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>
            .super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl;
    ((local_48.first.mKeyVals)->mData).second._M_t.
    super___uniq_ptr_impl<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FuncDefinition_*,_std::default_delete<Rml::FuncDefinition>_>.
    super__Head_base<0UL,_Rml::FuncDefinition_*,_false>._M_head_impl = (FuncDefinition *)uVar1;
    if (__ptr != (FuncDefinition *)0x0) {
      ::std::default_delete<Rml::FuncDefinition>::operator()
                ((default_delete<Rml::FuncDefinition> *)local_58._8_8_,__ptr);
      if ((FuncDefinition *)local_58._M_unused._0_8_ != (FuncDefinition *)0x0) {
        ::std::default_delete<Rml::FuncDefinition>::operator()
                  ((default_delete<Rml::FuncDefinition> *)local_58._M_pod_data,
                   (FuncDefinition *)local_58._M_unused._0_8_);
      }
    }
    variable.ptr = (void *)0x0;
    variable.definition = (VariableDefinition *)*(ulong *)uVar2;
    bVar3 = BindVariable(this,name,variable);
  }
  return bVar3;
}

Assistant:

bool DataModel::BindFunc(const String& name, DataGetFunc get_func, DataSetFunc set_func)
{
	auto result = function_variable_definitions.emplace(name, nullptr);
	auto& it = result.first;
	bool inserted = result.second;
	if (!inserted)
	{
		Log::Message(Log::LT_ERROR, "Data get/set function with name %s already exists in model", name.c_str());
		return false;
	}
	auto& func_definition_ptr = it->second;
	func_definition_ptr = MakeUnique<FuncDefinition>(std::move(get_func), std::move(set_func));

	return BindVariable(name, DataVariable(func_definition_ptr.get(), nullptr));
}